

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall
QtPrivate::QCalendarModel::cellForDate(QCalendarModel *this,QDate date,int *row,int *column)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QDate in_RCX;
  int *in_RDX;
  QCalendarModel *in_RDI;
  long in_FS_OFFSET;
  int r;
  int c;
  int requestedPosition;
  int columnForFirstOfShownMonth;
  QDate refDate;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined1 *local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDX != (int *)0x0) || ((undefined4 *)in_RCX.jd != (undefined4 *)0x0)) {
    if (in_RDX != (int *)0x0) {
      *in_RDX = -1;
    }
    if ((undefined4 *)in_RCX.jd != (undefined4 *)0x0) {
      *(undefined4 *)in_RCX.jd = 0xffffffff;
    }
    local_18[0] = &DAT_aaaaaaaaaaaaaaaa;
    local_18[0] = (undefined1 *)
                  referenceDate((QCalendarModel *)
                                CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    bVar1 = QDate::isValid((QDate *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if (bVar1) {
      iVar2 = columnForFirstOfMonth(in_RDI,in_RCX);
      iVar3 = QDate::daysTo((QDate *)local_18);
      iVar3 = (iVar3 - in_RDI->m_firstColumn) + iVar2;
      iVar4 = QDate::day(local_18,*(undefined8 *)&in_RDI->m_calendar);
      iVar4 = iVar3 + iVar4 + -1;
      iVar3 = iVar4 % 7;
      iVar4 = iVar4 / 7;
      if (iVar3 < 0) {
        iVar3 = iVar3 + 7;
        iVar4 = iVar4 + -1;
      }
      if (iVar2 - in_RDI->m_firstColumn < 1) {
        iVar4 = iVar4 + 1;
      }
      if ((((-1 < iVar4) && (iVar4 < 6)) && (-1 < iVar3)) && (iVar3 < 7)) {
        if (in_RDX != (int *)0x0) {
          *in_RDX = iVar4 + in_RDI->m_firstRow;
        }
        if ((int *)in_RCX.jd != (int *)0x0) {
          *(int *)in_RCX.jd = iVar3 + in_RDI->m_firstColumn;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCalendarModel::cellForDate(QDate date, int *row, int *column) const
{
    if (!row && !column)
        return;

    if (row)
        *row = -1;
    if (column)
        *column = -1;

    const QDate refDate = referenceDate();
    if (!refDate.isValid())
        return;

    const int columnForFirstOfShownMonth = columnForFirstOfMonth(refDate);
    const int requestedPosition = (refDate.daysTo(date) - m_firstColumn +
                                   columnForFirstOfShownMonth + refDate.day(m_calendar) - 1);

    int c = requestedPosition % 7;
    int r = requestedPosition / 7;
    if (c < 0) {
        c += 7;
        r -= 1;
    }

    if (columnForFirstOfShownMonth - m_firstColumn < MinimumDayOffset)
        r += 1;

    if (r < 0 || r > RowCount - 1 || c < 0 || c > ColumnCount - 1)
        return;

    if (row)
        *row = r + m_firstRow;
    if (column)
        *column = c + m_firstColumn;
}